

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverAppTest_ParseOptionsBeforeReadingProblem_Test::
SolverAppTest_ParseOptionsBeforeReadingProblem_Test
          (SolverAppTest_ParseOptionsBeforeReadingProblem_Test *this)

{
  SolverAppTest::SolverAppTest(&this->super_SolverAppTest);
  (this->super_SolverAppTest).super_Test._vptr_Test = (_func_int **)&PTR__SolverAppTest_00259ef0;
  return;
}

Assistant:

TEST_F(SolverAppTest, ParseOptionsBeforeReadingProblem) {
  AddOption();
  testing::InSequence sequence;
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_CALL(app_.reader(), DoRead(_, _, _));
  EXPECT_EQ(0, app_.Run(Args("test", "-w", "testproblem")));
}